

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GtestReportText.cpp
# Opt level: O0

void __thiscall
oout::GtestReportText::GtestReportText(GtestReportText *this,shared_ptr<const_oout::Result> *result)

{
  shared_ptr<const_oout::Result> *result_local;
  GtestReportText *this_local;
  
  Text::Text(&this->super_Text);
  (this->super_Text)._vptr_Text = (_func_int **)&PTR__GtestReportText_00325a18;
  std::shared_ptr<const_oout::Result>::shared_ptr(&this->result,result);
  return;
}

Assistant:

GtestReportText::GtestReportText(const std::shared_ptr<const Result> &result)
	: result(result)
{
}